

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
pstore::dump::string::write_character<std::ostream>
          (basic_ostream<char,_std::char_traits<char>_> *os,char ch)

{
  int iVar1;
  char local_19;
  
  if ((-1 < ch) && (iVar1 = isprint((uint)(byte)ch), iVar1 != 0)) {
    local_19 = ch;
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
    return os;
  }
  write_codepoint_hex<std::ostream,unsigned_char>(os,ch);
  return os;
}

Assistant:

OStream & string::write_character (OStream & os, char ch) {
            // Control characters are U+0000 through U+001F. Allow everything
            // else through as UTF-8.
            auto const uch = static_cast<unsigned char> (ch);
            if (uch < 128U && std::isprint (static_cast<int> (ch))) {
                os << ch;
            } else {
                write_codepoint_hex (os, uch);
            }
            return os;
        }